

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

Gia_Man_t * Gia_ManFromIfLogic(If_Man_t *pIfMan)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  Vec_Int_t *vLits_00;
  Vec_Int_t *vCover_00;
  Vec_Int_t *p_02;
  Vec_Int_t *vLeavesTemp;
  If_Obj_t *pObj_00;
  If_Cut_t *pCut;
  word *pwVar4;
  If_Obj_t *pIVar5;
  char *pcVar6;
  int *piVar7;
  Gia_Obj_t *pGVar8;
  FILE *__s;
  size_t __size;
  bool bVar9;
  char *local_688;
  char *local_638;
  bool local_541;
  char *pNameGen;
  char Buffer [1000];
  char *pStr;
  int status;
  FILE *pFile;
  Gia_Obj_t *pObj_1;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  word *pTruth;
  int Mask;
  int truthId;
  int nConfigInts;
  int nPermBitNum;
  int nTtBitNum;
  int Entry;
  int k;
  int i;
  sat_solver *pSat;
  Ifn_Ntk_t *pNtkCell;
  Vec_Str_t *vConfigsStr;
  Vec_Int_t *vLits;
  Vec_Int_t *vCover;
  Vec_Int_t *vLeaves2;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vConfigs;
  Vec_Int_t *vPacking;
  Vec_Int_t *vMapping2;
  Vec_Int_t *vMapping;
  If_Obj_t *pIfLeaf;
  If_Obj_t *pIfObj;
  If_Cut_t *pCutBest;
  Gia_Man_t *pHashed;
  Gia_Man_t *pNew;
  int fWriteConfigs;
  If_Man_t *pIfMan_local;
  
  vConfigs = (Vec_Int_t *)0x0;
  vLeaves = (Vec_Int_t *)0x0;
  pNtkCell = (Ifn_Ntk_t *)0x0;
  _k = (sat_solver *)0x0;
  if ((pIfMan->pPars->fDeriveLuts != 0) && (pIfMan->pPars->fTruth == 0)) {
    __assert_fail("!pIfMan->pPars->fDeriveLuts || pIfMan->pPars->fTruth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x702,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  iVar1 = If_ManObjNum(pIfMan);
  p = Vec_IntStart(iVar1);
  p_00 = Vec_IntStart(1);
  if ((pIfMan->pPars->fDeriveLuts != 0) &&
     ((((pIfMan->pPars->pLutStruct != (char *)0x0 || (pIfMan->pPars->fEnableCheck75 != 0)) ||
       (pIfMan->pPars->fEnableCheck75u != 0)) || (pIfMan->pPars->fEnableCheck07 != 0)))) {
    vConfigs = Vec_IntAlloc(1000);
    Vec_IntPush(vConfigs,0);
  }
  if (pIfMan->pPars->fUseDsdTune != 0) {
    iVar1 = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
    iVar2 = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
    iVar1 = Abc_BitWordNum(iVar1 + iVar2 + 1);
    vLeaves = Vec_IntAlloc(1000);
    Vec_IntPush(vLeaves,0);
    Vec_IntPush(vLeaves,iVar1);
    pNtkCell = (Ifn_Ntk_t *)Vec_StrAlloc(1000);
  }
  iVar1 = If_ManObjNum(pIfMan);
  p_01 = Gia_ManStart(iVar1);
  vLits_00 = Vec_IntAlloc(1000);
  vCover_00 = Vec_IntAlloc(0x10000);
  p_02 = Vec_IntAlloc(0x10);
  vLeavesTemp = Vec_IntAlloc(0x10);
  If_ManCleanCutData(pIfMan);
  for (Entry = 0; iVar1 = Vec_PtrSize(pIfMan->vObjs), Entry < iVar1; Entry = Entry + 1) {
    pObj_00 = (If_Obj_t *)Vec_PtrEntry(pIfMan->vObjs,Entry);
    if ((pObj_00->nRefs != 0) || (iVar1 = If_ObjIsTerm(pObj_00), iVar1 != 0)) {
      iVar1 = If_ObjIsAnd(pObj_00);
      if (iVar1 == 0) {
        iVar1 = If_ObjIsCi(pObj_00);
        if (iVar1 == 0) {
          iVar1 = If_ObjIsCo(pObj_00);
          if (iVar1 == 0) {
            iVar1 = If_ObjIsConst1(pObj_00);
            if (iVar1 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                            ,0x785,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
            }
            (pObj_00->field_22).iCopy = 1;
            iVar1 = Vec_IntSize(p_00);
            Vec_IntWriteEntry(p,0,iVar1);
            Vec_IntPush(p_00,0);
            Vec_IntPush(p_00,0);
          }
          else {
            pIVar5 = If_ObjFanin0(pObj_00);
            iVar1 = (pIVar5->field_22).iCopy;
            iVar2 = If_ObjFaninC0(pObj_00);
            iVar1 = Abc_LitNotCond(iVar1,iVar2);
            iVar1 = Gia_ManAppendCo(p_01,iVar1);
            (pObj_00->field_22).iCopy = iVar1;
          }
        }
        else {
          iVar1 = Gia_ManAppendCi(p_01);
          (pObj_00->field_22).iCopy = iVar1;
        }
      }
      else {
        pCut = If_ObjCutBest(pObj_00);
        if ((((((pIfMan->pPars->fUseTtPerm == 0) && (pIfMan->pPars->fDelayOpt == 0)) &&
              ((pIfMan->pPars->fDelayOptLut == 0 &&
               (((pIfMan->pPars->fDsdBalance == 0 && (pIfMan->pPars->pLutStruct == (char *)0x0)) &&
                (pIfMan->pPars->fUserRecLib == 0)))))) &&
             ((pIfMan->pPars->fUserSesLib == 0 && (pIfMan->pPars->nGateSize == 0)))) &&
            (pIfMan->pPars->fEnableCheck75 == 0)) &&
           (((pIfMan->pPars->fEnableCheck75u == 0 && (pIfMan->pPars->fEnableCheck07 == 0)) &&
            ((pIfMan->pPars->fUseDsdTune == 0 &&
             ((pIfMan->pPars->fUseCofVars == 0 && (pIfMan->pPars->fUseAndVars == 0)))))))) {
          If_CutRotatePins(pIfMan,pCut);
        }
        Vec_IntClear(p_02);
        nTtBitNum = 0;
        while( true ) {
          bVar9 = false;
          if (nTtBitNum < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
            vMapping = (Vec_Int_t *)If_ManObj(pIfMan,(int)(&pCut[1].Area)[nTtBitNum]);
            bVar9 = (If_Obj_t *)vMapping != (If_Obj_t *)0x0;
          }
          if (!bVar9) break;
          Vec_IntPush(p_02,vMapping[4].nCap);
          nTtBitNum = nTtBitNum + 1;
        }
        if ((pIfMan->pPars->fUseDsd == 0) || (pIfMan->pPars->pLutStruct == (char *)0x0)) {
          if ((pIfMan->pPars->fUseAndVars == 0) ||
             (((pIfMan->pPars->fUseCofVars == 0 || (pIfMan->pPars->fDeriveLuts == 0)) ||
              ((int)(*(uint *)&pCut->field_0x1c >> 0x18) <= pIfMan->pPars->nLutSize / 2)))) {
            if (((pIfMan->pPars->fUseAndVars == 0) || (pIfMan->pPars->fDeriveLuts == 0)) ||
               ((int)(*(uint *)&pCut->field_0x1c >> 0x18) <= pIfMan->pPars->nLutSize / 2)) {
              if (((pIfMan->pPars->fUseCofVars == 0) || (pIfMan->pPars->fDeriveLuts == 0)) ||
                 ((int)(*(uint *)&pCut->field_0x1c >> 0x18) <= pIfMan->pPars->nLutSize / 2)) {
                if ((((pIfMan->pPars->fDeriveLuts == 0) || (pIfMan->pPars->fTruth == 0)) &&
                    (pIfMan->pPars->fUseDsd == 0)) &&
                   ((pIfMan->pPars->fUseTtPerm == 0 &&
                    (pIfMan->pPars->pFuncCell2 ==
                     (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0)))) {
                  iVar1 = Gia_ManNodeIfToGia(p_01,pIfMan,pObj_00,p_02,0);
                  (pObj_00->field_22).iCopy = iVar1;
                  iVar1 = Abc_Lit2Var((pObj_00->field_22).iCopy);
                  iVar2 = Vec_IntSize(p_00);
                  Vec_IntSetEntry(p,iVar1,iVar2);
                  iVar1 = Vec_IntSize(p_02);
                  Vec_IntPush(p_00,iVar1);
                  for (nTtBitNum = 0; iVar1 = Vec_IntSize(p_02), nTtBitNum < iVar1;
                      nTtBitNum = nTtBitNum + 1) {
                    iVar1 = Vec_IntEntry(p_02,nTtBitNum);
                    iVar1 = Abc_Lit2Var(iVar1);
                    iVar2 = Abc_Lit2Var((pObj_00->field_22).iCopy);
                    if (iVar2 <= iVar1) {
                      __assert_fail("Abc_Lit2Var(Entry) < Abc_Lit2Var(pIfObj->iCopy)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                                    ,0x773,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
                    }
                  }
                  for (nTtBitNum = 0; iVar1 = Vec_IntSize(p_02), nTtBitNum < iVar1;
                      nTtBitNum = nTtBitNum + 1) {
                    iVar1 = Vec_IntEntry(p_02,nTtBitNum);
                    iVar1 = Abc_Lit2Var(iVar1);
                    Vec_IntPush(p_00,iVar1);
                  }
                  iVar1 = Abc_Lit2Var((pObj_00->field_22).iCopy);
                  Vec_IntPush(p_00,iVar1);
                }
                else {
                  pwVar4 = If_CutTruthW(pIfMan,pCut);
                  if (pIfMan->pPars->fUseTtPerm != 0) {
                    for (nTtBitNum = 0; nTtBitNum < (int)(*(uint *)&pCut->field_0x1c >> 0x18);
                        nTtBitNum = nTtBitNum + 1) {
                      iVar1 = If_CutLeafBit(pCut,nTtBitNum);
                      if (iVar1 != 0) {
                        iVar1 = Abc_TtWordNum(*(uint *)&pCut->field_0x1c >> 0x18);
                        Abc_TtFlip(pwVar4,iVar1,nTtBitNum);
                      }
                    }
                  }
                  local_541 = true;
                  if (pIfMan->pPars->fEnableCheck75 == 0) {
                    local_541 = pIfMan->pPars->fEnableCheck75u != 0;
                  }
                  iVar1 = Gia_ManFromIfLogicNode
                                    (pIfMan,p_01,Entry,p_02,vLeavesTemp,pwVar4,
                                     pIfMan->pPars->pLutStruct,vCover_00,p,p_00,vConfigs,
                                     (uint)local_541,pIfMan->pPars->fEnableCheck07);
                  (pObj_00->field_22).iCopy = iVar1;
                  iVar1 = Abc_LitNotCond((pObj_00->field_22).iCopy,
                                         *(uint *)&pCut->field_0x1c >> 0xc & 1);
                  (pObj_00->field_22).iCopy = iVar1;
                  if ((vLeaves != (Vec_Int_t *)0x0) && (iVar1 = Vec_IntSize(p_02), 1 < iVar1)) {
                    iVar1 = Abc_Lit2Var((pObj_00->field_22).iCopy);
                    pGVar8 = Gia_ManObj(p_01,iVar1);
                    iVar1 = Gia_ObjIsCi(pGVar8);
                    if ((iVar1 == 0) && (1 < (pObj_00->field_22).iCopy)) {
                      Gia_ManFromIfGetConfig
                                (vLeaves,pIfMan,pCut,(pObj_00->field_22).iCopy,(Vec_Str_t *)pNtkCell
                                );
                    }
                  }
                }
              }
              else {
                iVar1 = Gia_ManFromIfLogicCofVars
                                  (p_01,pIfMan,pCut,p_02,vLeavesTemp,vCover_00,p,p_00);
                (pObj_00->field_22).iCopy = iVar1;
              }
            }
            else {
              iVar1 = Gia_ManFromIfLogicAndVars(p_01,pIfMan,pCut,p_02,vLeavesTemp,vCover_00,p,p_00);
              (pObj_00->field_22).iCopy = iVar1;
            }
          }
          else {
            iVar1 = Abc_Lit2Var(pCut->iCutFunc);
            iVar1 = Vec_IntEntry(pIfMan->vTtDecs[*(uint *)&pCut->field_0x1c >> 0x18],iVar1);
            if (iVar1 == 0) {
              iVar1 = Gia_ManFromIfLogicCofVars(p_01,pIfMan,pCut,p_02,vLeavesTemp,vCover_00,p,p_00);
              (pObj_00->field_22).iCopy = iVar1;
            }
            else {
              iVar1 = Gia_ManFromIfLogicAndVars(p_01,pIfMan,pCut,p_02,vLeavesTemp,vCover_00,p,p_00);
              (pObj_00->field_22).iCopy = iVar1;
            }
          }
        }
        else {
          if (_k == (sat_solver *)0x0) {
            _k = (sat_solver *)If_ManSatBuildXY(*pIfMan->pPars->pLutStruct + -0x30);
          }
          if ((pIfMan->pPars->pLutStruct == (char *)0x0) || (pIfMan->pPars->fDeriveLuts == 0)) {
            pwVar4 = If_CutTruthW(pIfMan,pCut);
            iVar1 = Gia_ManFromIfLogicCreateLut(p_01,pwVar4,p_02,vCover_00,p,p_00);
            (pObj_00->field_22).iCopy = iVar1;
          }
          else {
            iVar1 = Gia_ManFromIfLogicFindLut
                              (pIfMan,p_01,pCut,_k,p_02,vLits_00,vCover_00,p,p_00,vConfigs);
            (pObj_00->field_22).iCopy = iVar1;
          }
          iVar1 = Abc_LitNotCond((pObj_00->field_22).iCopy,*(uint *)&pCut->field_0x1c >> 0xc & 1);
          (pObj_00->field_22).iCopy = iVar1;
        }
      }
    }
  }
  Vec_IntFree(vLits_00);
  Vec_IntFree(vCover_00);
  Vec_IntFree(p_02);
  Vec_IntFree(vLeavesTemp);
  if (_k != (sat_solver *)0x0) {
    sat_solver_delete(_k);
  }
  iVar1 = Vec_IntSize(p);
  iVar2 = Gia_ManObjNum(p_01);
  if (iVar2 < iVar1) {
    iVar1 = Gia_ManObjNum(p_01);
    Vec_IntShrink(p,iVar1);
  }
  else {
    iVar1 = Gia_ManObjNum(p_01);
    Vec_IntFillExtra(p,iVar1,0);
  }
  iVar1 = Vec_IntSize(p);
  iVar2 = Gia_ManObjNum(p_01);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x798,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  for (Entry = 0; iVar1 = Vec_IntSize(p), Entry < iVar1; Entry = Entry + 1) {
    iVar1 = Vec_IntEntry(p,Entry);
    if (0 < iVar1) {
      iVar1 = Gia_ManObjNum(p_01);
      Vec_IntAddToEntry(p,Entry,iVar1);
    }
  }
  Vec_IntAppend(p,p_00);
  Vec_IntFree(p_00);
  if (p_01->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x79f,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  if (p_01->vPacking != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vPacking == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x7a0,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  if (p_01->vConfigs == (Vec_Int_t *)0x0) {
    if (p_01->pCellStr != (char *)0x0) {
      __assert_fail("pNew->pCellStr == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                    ,0x7a2,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
    }
    p_01->vMapping = p;
    p_01->vPacking = vConfigs;
    p_01->vConfigs = vLeaves;
    if (vLeaves == (Vec_Int_t *)0x0) {
      local_638 = (char *)0x0;
    }
    else {
      pcVar6 = If_DsdManGetCellStr(pIfMan->pIfDsdMan);
      local_638 = Abc_UtilStrsav(pcVar6);
    }
    p_01->pCellStr = local_638;
    if (vLeaves != (Vec_Int_t *)0x0) {
      iVar1 = Vec_IntSize(vLeaves);
      iVar2 = Vec_IntEntry(vLeaves,0);
      iVar3 = Vec_IntEntry(vLeaves,1);
      if (iVar1 != iVar2 * iVar3 + 2) {
        __assert_fail("!vConfigs || Vec_IntSize(vConfigs) == 2 + Vec_IntEntry(vConfigs, 0) * Vec_IntEntry(vConfigs, 1)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                      ,0x7a7,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
      }
    }
    Entry = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p_01->vCos);
      bVar9 = false;
      if (Entry < iVar1) {
        pFanin = Gia_ManCo(p_01,Entry);
        bVar9 = pFanin != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      pGVar8 = Gia_ObjFanin0(pFanin);
      iVar1 = Gia_ObjIsAnd(pGVar8);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFaninId0p(p_01,pFanin);
        iVar1 = Gia_ObjIsLut(p_01,iVar1);
        if (iVar1 == 0) {
          __assert_fail("!Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                        ,0x7ac,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
        }
      }
      Entry = Entry + 1;
    }
    for (Entry = 1; iVar1 = Gia_ManObjNum(p_01), Entry < iVar1; Entry = Entry + 1) {
      iVar1 = Gia_ObjIsLut(p_01,Entry);
      if (iVar1 != 0) {
        for (nTtBitNum = 0; iVar1 = Gia_ObjLutSize(p_01,Entry), nTtBitNum < iVar1;
            nTtBitNum = nTtBitNum + 1) {
          piVar7 = Gia_ObjLutFanins(p_01,Entry);
          pGVar8 = Gia_ManObj(p_01,piVar7[nTtBitNum]);
          iVar1 = Gia_ObjIsAnd(pGVar8);
          if (iVar1 != 0) {
            iVar1 = Gia_ObjId(p_01,pGVar8);
            iVar1 = Gia_ObjIsLut(p_01,iVar1);
            if (iVar1 == 0) {
              __assert_fail("!Gia_ObjIsAnd(pFanin) || Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pFanin))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                            ,0x7b3,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
            }
          }
        }
      }
    }
    Entry = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p_01->vCis);
      bVar9 = false;
      if (Entry < iVar1) {
        pFile = (FILE *)Gia_ManCi(p_01,Entry);
        bVar9 = pFile != (FILE *)0x0;
      }
      if (!bVar9) break;
      iVar1 = Gia_ObjId(p_01,(Gia_Obj_t *)pFile);
      iVar1 = Gia_ObjIsLut(p_01,iVar1);
      if (iVar1 != 0) {
        __assert_fail("!Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pObj))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                      ,0x7b9,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
      }
      Entry = Entry + 1;
    }
    if (pNtkCell != (Ifn_Ntk_t *)0x0) {
      memset(&pNameGen,0,1000);
      if (pIfMan->pName == (char *)0x0) {
        local_688 = "nameless_";
      }
      else {
        local_688 = Extra_FileNameGeneric(pIfMan->pName);
      }
      sprintf((char *)&pNameGen,"%s_configs.txt",local_688);
      if (local_688 != (char *)0x0) {
        free(local_688);
      }
      __s = fopen((char *)&pNameGen,"wb");
      if (__s == (FILE *)0x0) {
        printf("Cannot open file \"%s\".\n",&pNameGen);
      }
      else {
        Vec_StrPush((Vec_Str_t *)pNtkCell,'\0');
        pcVar6 = Vec_StrArray((Vec_Str_t *)pNtkCell);
        __size = strlen(pcVar6);
        fwrite(pcVar6,__size,1,__s);
        Vec_StrFree((Vec_Str_t *)pNtkCell);
        fclose(__s);
        printf("Finished dumping configs into file \"%s\".\n",&pNameGen);
      }
    }
    return p_01;
  }
  __assert_fail("pNew->vConfigs == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                ,0x7a1,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManFromIfLogic( If_Man_t * pIfMan )
{
    int fWriteConfigs = 1;
    Gia_Man_t * pNew, * pHashed = NULL;
    If_Cut_t * pCutBest;
    If_Obj_t * pIfObj, * pIfLeaf;
    Vec_Int_t * vMapping, * vMapping2, * vPacking = NULL, * vConfigs = NULL;
    Vec_Int_t * vLeaves, * vLeaves2, * vCover, * vLits;
    Vec_Str_t * vConfigsStr = NULL;
    Ifn_Ntk_t * pNtkCell = NULL;
    sat_solver * pSat = NULL;
    int i, k, Entry;
    assert( !pIfMan->pPars->fDeriveLuts || pIfMan->pPars->fTruth );
//    if ( pIfMan->pPars->fEnableCheck07 )
//        pIfMan->pPars->fDeriveLuts = 0;
    // start mapping and packing
    vMapping  = Vec_IntStart( If_ManObjNum(pIfMan) );
    vMapping2 = Vec_IntStart( 1 );
    if ( pIfMan->pPars->fDeriveLuts && (pIfMan->pPars->pLutStruct || pIfMan->pPars->fEnableCheck75 || pIfMan->pPars->fEnableCheck75u || pIfMan->pPars->fEnableCheck07) )
    {
        vPacking = Vec_IntAlloc( 1000 );
        Vec_IntPush( vPacking, 0 );
    }
    if ( pIfMan->pPars->fUseDsdTune )
    {
        int nTtBitNum = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
        int nPermBitNum = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
        int nConfigInts = Abc_BitWordNum(nTtBitNum + nPermBitNum + 1);
        vConfigs = Vec_IntAlloc( 1000 );
        Vec_IntPush( vConfigs, 0 );
        Vec_IntPush( vConfigs, nConfigInts );
        if ( fWriteConfigs )
            vConfigsStr = Vec_StrAlloc( 1000 );
    }
    // create new manager
    pNew = Gia_ManStart( If_ManObjNum(pIfMan) );
    // iterate through nodes used in the mapping
    vLits    = Vec_IntAlloc( 1000 );
    vCover   = Vec_IntAlloc( 1 << 16 );
    vLeaves  = Vec_IntAlloc( 16 );
    vLeaves2 = Vec_IntAlloc( 16 );
    If_ManCleanCutData( pIfMan );
    If_ManForEachObj( pIfMan, pIfObj, i )
    {
        if ( pIfObj->nRefs == 0 && !If_ObjIsTerm(pIfObj) )
            continue;
        if ( If_ObjIsAnd(pIfObj) )
        {
            pCutBest = If_ObjCutBest( pIfObj );
            // perform sorting of cut leaves by delay, so that the slowest pin drives the fastest input of the LUT
            if ( !pIfMan->pPars->fUseTtPerm && !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDelayOptLut && !pIfMan->pPars->fDsdBalance && 
                 !pIfMan->pPars->pLutStruct && !pIfMan->pPars->fUserRecLib && !pIfMan->pPars->fUserSesLib && !pIfMan->pPars->nGateSize && 
                 !pIfMan->pPars->fEnableCheck75 && !pIfMan->pPars->fEnableCheck75u && !pIfMan->pPars->fEnableCheck07 && !pIfMan->pPars->fUseDsdTune && 
                 !pIfMan->pPars->fUseCofVars && !pIfMan->pPars->fUseAndVars )
                If_CutRotatePins( pIfMan, pCutBest );
            // collect leaves of the best cut
            Vec_IntClear( vLeaves );
            If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, k )
                Vec_IntPush( vLeaves, pIfLeaf->iCopy );
            // perform one of the two types of mapping: with and without structures
            if ( pIfMan->pPars->fUseDsd && pIfMan->pPars->pLutStruct )
            {
                if ( pSat == NULL )
                    pSat = (sat_solver *)If_ManSatBuildXY( (int)(pIfMan->pPars->pLutStruct[0] - '0') );
                if ( pIfMan->pPars->pLutStruct && pIfMan->pPars->fDeriveLuts )
                    pIfObj->iCopy = Gia_ManFromIfLogicFindLut( pIfMan, pNew, pCutBest, pSat, vLeaves, vLits, vCover, vMapping, vMapping2, vPacking );
                else
                    pIfObj->iCopy = Gia_ManFromIfLogicCreateLut( pNew, If_CutTruthW(pIfMan, pCutBest), vLeaves, vCover, vMapping, vMapping2 );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
            }
/*
            else if ( pIfMan->pPars->fUseDsd && pIfMan->pPars->fUseDsdTune && pIfMan->pPars->fDeriveLuts )
            {
                if ( pNtkCell == NULL )
                {
                    assert( If_DsdManGetCellStr(pIfMan->pIfDsdMan) != NULL );
                    pNtkCell = Ifn_NtkParse( If_DsdManGetCellStr(pIfMan->pIfDsdMan) );
                    nLutMax = Ifn_NtkLutSizeMax( pNtkCell );
                    pHashed = Gia_ManStart( 10000 );
                    Vec_IntFillExtra( &pHashed->vCopies, 10000, -1 );
                    for ( k = 0; k < pIfMan->pPars->nLutSize; k++ )
                        Gia_ManAppendCi( pHashed );
                    Gia_ManHashAlloc( pHashed );
                }
                pIfObj->iCopy = Gia_ManFromIfLogicFindCell( pIfMan, pNew, pHashed, pCutBest, pNtkCell, nLutMax, vLeaves, vLits, vCover, vMapping, vMapping2, vConfigs );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
            }
*/
            else if ( pIfMan->pPars->fUseAndVars && pIfMan->pPars->fUseCofVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                int truthId = Abc_Lit2Var(pCutBest->iCutFunc);
                int Mask = Vec_IntEntry(pIfMan->vTtDecs[pCutBest->nLeaves], truthId);
                if ( Mask )
                    pIfObj->iCopy = Gia_ManFromIfLogicAndVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
                else
                    pIfObj->iCopy = Gia_ManFromIfLogicCofVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( pIfMan->pPars->fUseAndVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                pIfObj->iCopy = Gia_ManFromIfLogicAndVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( pIfMan->pPars->fUseCofVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                pIfObj->iCopy = Gia_ManFromIfLogicCofVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( (pIfMan->pPars->fDeriveLuts && pIfMan->pPars->fTruth) || pIfMan->pPars->fUseDsd || pIfMan->pPars->fUseTtPerm || pIfMan->pPars->pFuncCell2 )
            {
                word * pTruth = If_CutTruthW(pIfMan, pCutBest);
                if ( pIfMan->pPars->fUseTtPerm )
                    for ( k = 0; k < (int)pCutBest->nLeaves; k++ )
                        if ( If_CutLeafBit(pCutBest, k) )
                            Abc_TtFlip( pTruth, Abc_TtWordNum(pCutBest->nLeaves), k );
                // perform decomposition of the cut
                pIfObj->iCopy = Gia_ManFromIfLogicNode( pIfMan, pNew, i, vLeaves, vLeaves2, pTruth, pIfMan->pPars->pLutStruct, vCover, vMapping, vMapping2, vPacking, (pIfMan->pPars->fEnableCheck75 || pIfMan->pPars->fEnableCheck75u), pIfMan->pPars->fEnableCheck07 );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
                if ( vConfigs && Vec_IntSize(vLeaves) > 1 && !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(pIfObj->iCopy))) && pIfObj->iCopy > 1 )
                    Gia_ManFromIfGetConfig( vConfigs, pIfMan, pCutBest, pIfObj->iCopy, vConfigsStr );
            }
            else
            {
                pIfObj->iCopy = Gia_ManNodeIfToGia( pNew, pIfMan, pIfObj, vLeaves, 0 );
                // write mapping
                Vec_IntSetEntry( vMapping, Abc_Lit2Var(pIfObj->iCopy), Vec_IntSize(vMapping2) );
                Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    assert( Abc_Lit2Var(Entry) < Abc_Lit2Var(pIfObj->iCopy) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    Vec_IntPush( vMapping2, Abc_Lit2Var(Entry)  );
                Vec_IntPush( vMapping2, Abc_Lit2Var(pIfObj->iCopy) );
            }
        }
        else if ( If_ObjIsCi(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCi(pNew);
        else if ( If_ObjIsCo(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCo( pNew, Abc_LitNotCond(If_ObjFanin0(pIfObj)->iCopy, If_ObjFaninC0(pIfObj)) );
        else if ( If_ObjIsConst1(pIfObj) )
        {
            pIfObj->iCopy = 1;
            // create const LUT
            Vec_IntWriteEntry( vMapping, 0, Vec_IntSize(vMapping2) );
            Vec_IntPush( vMapping2, 0 );
            Vec_IntPush( vMapping2, 0 );
        }
        else assert( 0 );
    }
    Vec_IntFree( vLits );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vLeaves2 );
    if ( pNtkCell )
        ABC_FREE( pNtkCell );
    if ( pSat )
        sat_solver_delete(pSat);
    if ( pHashed )
        Gia_ManStop( pHashed );
//    printf( "Mapping array size:  IfMan = %d. Gia = %d. Increase = %.2f\n", 
//        If_ManObjNum(pIfMan), Gia_ManObjNum(pNew), 1.0 * Gia_ManObjNum(pNew) / If_ManObjNum(pIfMan) );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, Entry, i )
        if ( Entry > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    assert( pNew->vPacking == NULL );
    assert( pNew->vConfigs == NULL );
    assert( pNew->pCellStr == NULL );
    pNew->vMapping = vMapping;
    pNew->vPacking = vPacking;
    pNew->vConfigs = vConfigs;
    pNew->pCellStr = vConfigs ? Abc_UtilStrsav( If_DsdManGetCellStr(pIfMan->pIfDsdMan) ) : NULL;
    assert( !vConfigs || Vec_IntSize(vConfigs) == 2 + Vec_IntEntry(vConfigs, 0) * Vec_IntEntry(vConfigs, 1) );
    // verify that COs have mapping
    {
        Gia_Obj_t * pObj;
        Gia_ManForEachCo( pNew, pObj, i )
           assert( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj)) );
    }
    // verify that internal nodes have mapping
    {
        Gia_Obj_t * pFanin;
        Gia_ManForEachLut( pNew, i )
            Gia_LutForEachFaninObj( pNew, i, pFanin, k )
                assert( !Gia_ObjIsAnd(pFanin) || Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pFanin)) );
    }
    // verify that CIs have no mapping
    {
        Gia_Obj_t * pObj;
        Gia_ManForEachCi( pNew, pObj, i )
           assert( !Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pObj)) );
    }
    // dump configuration strings
    if ( vConfigsStr )
    {
        FILE * pFile; int status;
        char * pStr, Buffer[1000] = {0};
        const char * pNameGen = pIfMan->pName? Extra_FileNameGeneric( pIfMan->pName ) : "nameless_";
        sprintf( Buffer, "%s_configs.txt", pNameGen );
        ABC_FREE( pNameGen );
        pFile = fopen( Buffer, "wb" );
        if ( pFile == NULL )
        {
            printf( "Cannot open file \"%s\".\n", Buffer );
            return pNew;
        }
        Vec_StrPush( vConfigsStr, '\0' );
        pStr = Vec_StrArray(vConfigsStr);
        status = fwrite( pStr, strlen(pStr), 1, pFile );
        Vec_StrFree( vConfigsStr );
        fclose( pFile );
        printf( "Finished dumping configs into file \"%s\".\n", Buffer );
    }
    return pNew;
}